

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1fad4::ChecksumOnlyFileSystem_basic_Test::TestBody
          (ChecksumOnlyFileSystem_basic_Test *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  int iVar3;
  pointer *__ptr;
  SmallVectorImpl<char> *in_R8;
  char *pcVar4;
  char *in_R9;
  StringRef Suffix;
  StringRef Filename;
  AssertionResult gtest_ar_;
  undefined1 local_228 [8];
  error_code ec;
  StringRef local_200;
  AssertHelper local_1f0;
  long *local_1e8;
  __uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  local_1e0;
  AssertHelper local_1d8;
  FileInfo ourFileInfo;
  FileInfo missingFileInfo;
  SmallString<256U> tempPath;
  
  llbuild::basic::createLocalFileSystem();
  llbuild::basic::ChecksumOnlyFileSystem::from
            ((ChecksumOnlyFileSystem *)local_228,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_1e0);
  if (local_1e0._M_t.
      super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
      .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
       )0x0) {
    (**(code **)(*(long *)local_1e0._M_t.
                          super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                          .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl +
                8))();
  }
  local_1e0._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl =
       (tuple<llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>)
       (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
        )0x0;
  tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &tempPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
  tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::Twine::Twine((Twine *)&missingFileInfo,"FileSystemTests");
  Suffix.Length = (size_t)&tempPath;
  Suffix.Data = (char *)0x3;
  llvm::sys::fs::createTemporaryFile((fs *)&missingFileInfo,(Twine *)0x180a15,Suffix,in_R8);
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  Filename.Length._0_4_ =
       tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  Filename.Data =
       (char *)tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.BeginX;
  Filename.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream((raw_fd_ostream *)&missingFileInfo,Filename,&ec,F_Text);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = ec._M_value == 0;
  if (ec._M_value != 0) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ourFileInfo,(internal *)&gtest_ar_,(AssertionResult *)0x180e70,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xc9,(char *)ourFileInfo.device);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::_M_dispose();
    if ((long *)local_200.Data != (long *)0x0) {
      (**(code **)(*(long *)local_200.Data + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar3 = 0x180817;
  llvm::raw_ostream::operator<<((raw_ostream *)&missingFileInfo,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&missingFileInfo,iVar3);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&missingFileInfo);
  auVar1 = local_228;
  std::__cxx11::string::string((string *)&ourFileInfo,"/does/not/exists",(allocator *)&ec);
  (**(code **)(*(_func_int **)auVar1 + 0x38))(&missingFileInfo,auVar1,&ourFileInfo);
  std::__cxx11::string::_M_dispose();
  bVar2 = llbuild::basic::FileInfo::isMissing(&missingFileInfo);
  ec._M_value = CONCAT31(ec._M_value._1_3_,bVar2);
  ec._M_cat = (error_category *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ourFileInfo,(internal *)&ec,
               (AssertionResult *)"missingFileInfo.isMissing()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xcf,(char *)ourFileInfo.device);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    std::__cxx11::string::_M_dispose();
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ec._M_cat);
  auVar1 = local_228;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  gtest_ar_._0_8_ =
       tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.BeginX;
  llvm::StringRef::str_abi_cxx11_((string *)&ec,(StringRef *)&gtest_ar_);
  (**(code **)(*(_func_int **)auVar1 + 0x38))(&ourFileInfo,auVar1,(string *)&ec);
  std::__cxx11::string::_M_dispose();
  bVar2 = llbuild::basic::FileInfo::isMissing(&ourFileInfo);
  gtest_ar_.success_ = !bVar2;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ec,(internal *)&gtest_ar_,(AssertionResult *)"ourFileInfo.isMissing()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd2,(char *)CONCAT44(ec._4_4_,ec._M_value));
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::_M_dispose();
    if ((long *)local_200.Data != (long *)0x0) {
      (**(code **)(*(long *)local_200.Data + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
            ((internal *)&ec,"ourFileInfo.device","0ull",&ourFileInfo.device,
             (unsigned_long_long *)&gtest_ar_);
  if ((char)ec._M_value == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (ec._M_cat == (error_category *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)ec._M_cat;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ec._M_cat);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
            ((internal *)&ec,"ourFileInfo.inode","0ull",&ourFileInfo.inode,
             (unsigned_long_long *)&gtest_ar_);
  if ((char)ec._M_value == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (ec._M_cat == (error_category *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)ec._M_cat;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ec._M_cat);
  auVar1 = local_228;
  std::__cxx11::string::string((string *)&ec,"/does/not/exist",(allocator *)&gtest_ar_);
  (**(code **)(*(_func_int **)auVar1 + 0x20))(&local_1f0,auVar1,&ec);
  std::__cxx11::string::_M_dispose();
  gtest_ar_._0_8_ = local_1f0.data_;
  local_200.Data = (char *)0x0;
  testing::internal::CmpHelperEQ<llvm::MemoryBuffer*,decltype(nullptr)>
            ((internal *)&ec,"missingFileContents.get()","nullptr",(MemoryBuffer **)&gtest_ar_,
             &local_200.Data);
  if ((char)ec._M_value == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (ec._M_cat == (error_category *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)ec._M_cat;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ec._M_cat);
  auVar1 = local_228;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  gtest_ar_._0_8_ =
       tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.BeginX;
  llvm::StringRef::str_abi_cxx11_((string *)&ec,(StringRef *)&gtest_ar_);
  (**(code **)(*(_func_int **)auVar1 + 0x20))(&local_1e8,auVar1,(string *)&ec);
  std::__cxx11::string::_M_dispose();
  local_200.Data = (char *)local_1e8[1];
  local_200.Length = local_1e8[2] - (long)local_200.Data;
  llvm::StringRef::str_abi_cxx11_((string *)&ec,&local_200);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[14]>
            ((internal *)&gtest_ar_,"ourFileContents->getBuffer().str()","\"Hello, world!\"",
             (string *)&ec,(char (*) [14])"Hello, world!");
  std::__cxx11::string::_M_dispose();
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&ec);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xdb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&ec);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if ((long *)CONCAT44(ec._4_4_,ec._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(ec._4_4_,ec._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  gtest_ar_._0_8_ =
       tempPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.BeginX;
  llvm::Twine::Twine((Twine *)&ec,(StringRef *)&gtest_ar_);
  iVar3 = llvm::sys::fs::remove((fs *)&ec,(char *)0x1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar3 == 0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ec,(internal *)&gtest_ar_,(AssertionResult *)0x180e70,"true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xde,(char *)CONCAT44(ec._4_4_,ec._M_value));
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::_M_dispose();
    if ((long *)local_200.Data != (long *)0x0) {
      (**(code **)(*(long *)local_200.Data + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  if (local_1e8 != (long *)0x0) {
    (**(code **)(*local_1e8 + 8))();
  }
  if (local_1f0.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_1f0.data_ + 8))();
  }
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&tempPath);
  if (local_228 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_228 + 8))();
  }
  return;
}

Assistant:

TEST(ChecksumOnlyFileSystem, basic) {
  // Check basic sanity of the local filesystem object.
  auto fs = ChecksumOnlyFileSystem::from(createLocalFileSystem());

  // Write a temp file.
  SmallString<256> tempPath;
  llvm::sys::fs::createTemporaryFile("FileSystemTests", "txt", tempPath);
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(tempPath.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  auto missingFileInfo = fs->getFileInfo("/does/not/exists");
  EXPECT_TRUE(missingFileInfo.isMissing());

  auto ourFileInfo = fs->getFileInfo(tempPath.str());
  EXPECT_FALSE(ourFileInfo.isMissing());

  EXPECT_EQ(ourFileInfo.device, 0ull);
  EXPECT_EQ(ourFileInfo.inode, 0ull);

  auto missingFileContents = fs->getFileContents("/does/not/exist");
  EXPECT_EQ(missingFileContents.get(), nullptr);

  auto ourFileContents = fs->getFileContents(tempPath.str());
  EXPECT_EQ(ourFileContents->getBuffer().str(), "Hello, world!");
  // Remove the temporary file.
  auto ec = llvm::sys::fs::remove(tempPath.str());
  EXPECT_FALSE(ec);
}